

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1ba5289::OriginPubkeyProvider::ToPrivateString
          (OriginPubkeyProvider *this,SigningProvider *arg,string *ret)

{
  uint uVar1;
  pointer pPVar2;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  byte bVar3;
  string sub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff28;
  StringType in_stack_ffffffffffffff2c;
  OriginPubkeyProvider *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_RDI);
  pPVar2 = std::
           unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           ::operator->((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                         *)in_stack_fffffffffffffef8);
  uVar1 = (*pPVar2->_vptr_PubkeyProvider[6])(pPVar2,in_RSI,local_28);
  bVar3 = (uVar1 & 1) != 0;
  if ((bool)bVar3) {
    (anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0));
    std::operator+((char *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::operator+(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    std::__cxx11::string::~string(in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(in_stack_fffffffffffffef8);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool ToPrivateString(const SigningProvider& arg, std::string& ret) const override
    {
        std::string sub;
        if (!m_provider->ToPrivateString(arg, sub)) return false;
        ret = "[" + OriginString(StringType::PUBLIC) + "]" + std::move(sub);
        return true;
    }